

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Compiler::execution_is_noop(Compiler *this,SPIRBlock *from,SPIRBlock *to)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  size_t sVar3;
  Phi *pPVar4;
  bool bVar5;
  SPIRBlock *pSVar6;
  SPIRBlock *pSVar7;
  long lVar8;
  
  bVar5 = execution_is_branchless(this,from,to);
  if (bVar5) {
    do {
      bVar5 = (from->super_IVariant).self.id == (to->super_IVariant).self.id;
      if (bVar5) {
        return bVar5;
      }
      if ((from->ops).super_VectorView<spirv_cross::Instruction>.buffer_size != 0) {
        return false;
      }
      pSVar6 = Variant::get<spirv_cross::SPIRBlock>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          (from->next_block).id);
      sVar3 = (pSVar6->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.buffer_size;
      bVar5 = sVar3 == 0;
      pSVar7 = pSVar6;
      if (!bVar5) {
        pPVar4 = (pSVar6->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>.ptr;
        uVar2 = (from->super_IVariant).self.id;
        pSVar7 = from;
        if ((pPVar4->parent).id != uVar2) {
          lVar8 = 0;
          do {
            bVar5 = sVar3 * 0xc + -0xc == lVar8;
            pSVar7 = pSVar6;
            if (bVar5) break;
            puVar1 = (uint32_t *)((long)&pPVar4[1].parent.id + lVar8);
            pSVar7 = from;
            lVar8 = lVar8 + 0xc;
          } while (*puVar1 != uVar2);
        }
      }
      from = pSVar7;
    } while (bVar5);
  }
  return false;
}

Assistant:

bool Compiler::execution_is_noop(const SPIRBlock &from, const SPIRBlock &to) const
{
	if (!execution_is_branchless(from, to))
		return false;

	auto *start = &from;
	for (;;)
	{
		if (start->self == to.self)
			return true;

		if (!start->ops.empty())
			return false;

		auto &next = get<SPIRBlock>(start->next_block);
		// Flushing phi variables does not count as noop.
		for (auto &phi : next.phi_variables)
			if (phi.parent == start->self)
				return false;

		start = &next;
	}
}